

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

void __thiscall QSslCertificate::clear(QSslCertificate *this)

{
  bool bVar1;
  QSslCertificatePrivate *this_00;
  
  bVar1 = isNull(this);
  if (bVar1) {
    return;
  }
  this_00 = (QSslCertificatePrivate *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(this_00);
  QExplicitlySharedDataPointer<QSslCertificatePrivate>::reset(&this->d,this_00);
  return;
}

Assistant:

void QSslCertificate::clear()
{
    if (isNull())
        return;
    d = new QSslCertificatePrivate;
}